

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_functions_to_test.hpp
# Opt level: O0

void duckdb::udf_max_flat<double>(DataChunk *args,ExpressionState *state,Vector *result)

{
  double *__s;
  idx_t iVar1;
  double *pdVar2;
  vector<duckdb::Vector,_true> *pvVar3;
  VectorType in_DL;
  DataChunk *in_RDI;
  double dVar4;
  idx_t i;
  double *input_data;
  value_type *input;
  idx_t col_idx;
  double *result_data;
  size_type in_stack_ffffffffffffff98;
  vector<duckdb::Vector,_true> *in_stack_ffffffffffffffa0;
  vector<duckdb::Vector,_true> *local_40;
  ulong local_28;
  
  duckdb::DataChunk::Flatten();
  duckdb::Vector::SetVectorType(in_DL);
  __s = FlatVector::GetData<double>((Vector *)0x4d2663);
  dVar4 = std::numeric_limits<double>::min();
  iVar1 = DataChunk::size(in_RDI);
  memset(__s,(int)dVar4 & 0xff,iVar1 << 3);
  local_28 = 0;
  while( true ) {
    iVar1 = DataChunk::ColumnCount((DataChunk *)0x4d26be);
    if (iVar1 <= local_28) break;
    vector<duckdb::Vector,_true>::operator[](in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    pdVar2 = FlatVector::GetData<double>((Vector *)0x4d26ed);
    local_40 = (vector<duckdb::Vector,_true> *)0x0;
    while( true ) {
      in_stack_ffffffffffffffa0 = local_40;
      pvVar3 = (vector<duckdb::Vector,_true> *)DataChunk::size(in_RDI);
      if (pvVar3 <= in_stack_ffffffffffffffa0) break;
      if (__s[(long)local_40] < pdVar2[(long)local_40]) {
        __s[(long)local_40] = pdVar2[(long)local_40];
      }
      local_40 = local_40 + 1;
    }
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

static void udf_max_flat(DataChunk &args, ExpressionState &state, Vector &result) {
	args.Flatten();
	D_ASSERT(TypeIsNumeric(GetTypeId<TYPE>()));

	result.SetVectorType(VectorType::FLAT_VECTOR);
	auto result_data = FlatVector::GetData<TYPE>(result);

	// Initialize the result vector with the minimum value from TYPE.
	memset(result_data, std::numeric_limits<TYPE>::min(), args.size() * sizeof(TYPE));

	for (idx_t col_idx = 0; col_idx < args.ColumnCount(); col_idx++) {
		auto &input = args.data[col_idx];
		D_ASSERT((GetTypeId<TYPE>()) == input.GetType().InternalType());
		auto input_data = FlatVector::GetData<TYPE>(input);
		for (idx_t i = 0; i < args.size(); ++i) {
			if (result_data[i] < input_data[i]) {
				result_data[i] = input_data[i];
			}
		}
	}
}